

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

aiMesh * __thiscall Assimp::Ogre::SubMesh::ConvertToAssimpMesh(SubMesh *this,Mesh *parent)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  size_t __n;
  VertexData *this_00;
  pointer pVVar3;
  element_type *peVar4;
  pointer ppBVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  VertexElement *element_3;
  aiMesh *paVar8;
  VertexData **ppVVar9;
  ulong *puVar10;
  aiFace *paVar11;
  aiVector3D *paVar12;
  size_t sVar13;
  Logger *pLVar14;
  void *pvVar15;
  uint *puVar16;
  aiBone **ppaVar17;
  pointer ppBVar18;
  mapped_type *boneWeights;
  aiBone *paVar19;
  _Base_ptr p_Var20;
  runtime_error *prVar21;
  iterator __end2;
  aiFace *paVar22;
  Type type;
  Type type_00;
  VertexElement *element;
  size_t ii;
  ulong uVar23;
  ulong uVar24;
  Bone *pBVar25;
  pointer pVVar26;
  pointer pVVar27;
  pointer pVVar28;
  pointer pVVar29;
  long lVar30;
  Bone *this_01;
  size_t v;
  long lVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> referencedBones;
  uint16_t iout;
  MemoryStream *local_2d0;
  MemoryStream *local_2c8;
  aiVector3D *local_2b0;
  aiVector3D *local_2a8;
  MemoryStream *local_2a0;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_280;
  string local_250;
  size_t local_230;
  ulong local_228;
  size_t local_220;
  ulong local_218;
  long local_210;
  size_t local_208;
  ulong local_200;
  aiVector3D **local_1f8;
  long local_1f0;
  MemoryStream *local_1e8;
  pointer local_1e0;
  pointer local_1d8;
  long local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  size_t local_1b8;
  pointer local_1b0;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_1a8 [2];
  ios_base local_138 [264];
  
  if ((this->super_ISubMesh).operationType != OT_TRIANGLE_LIST) {
    prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Only mesh operation type OT_TRIANGLE_LIST is supported. Found "
               ,0x3e);
    std::ostream::operator<<(local_1a8,(this->super_ISubMesh).operationType);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar21,(string *)&local_280);
    *(undefined ***)prVar21 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar8 = (aiMesh *)operator_new(0x520);
  paVar8->mPrimitiveTypes = 0;
  paVar8->mNumVertices = 0;
  paVar8->mNumFaces = 0;
  local_1f8 = &paVar8->mVertices;
  memset(local_1f8,0,0xcc);
  paVar8->mBones = (aiBone **)0x0;
  paVar8->mMaterialIndex = 0;
  (paVar8->mName).length = 0;
  (paVar8->mName).data[0] = '\0';
  memset((paVar8->mName).data + 1,0x1b,0x3ff);
  paVar8->mNumAnimMeshes = 0;
  paVar8->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar8->mMethod = 0;
  (paVar8->mAABB).mMin.x = 0.0;
  (paVar8->mAABB).mMin.y = 0.0;
  (paVar8->mAABB).mMin.z = 0.0;
  (paVar8->mAABB).mMax.x = 0.0;
  (paVar8->mAABB).mMax.y = 0.0;
  (paVar8->mAABB).mMax.z = 0.0;
  paVar8->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar8->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar8->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar8->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar8->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar8->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar8->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar8->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar8->mNumUVComponents[0] = 0;
  paVar8->mNumUVComponents[1] = 0;
  paVar8->mNumUVComponents[2] = 0;
  paVar8->mNumUVComponents[3] = 0;
  paVar8->mNumUVComponents[4] = 0;
  paVar8->mNumUVComponents[5] = 0;
  paVar8->mNumUVComponents[6] = 0;
  paVar8->mNumUVComponents[7] = 0;
  paVar8->mColors[0] = (aiColor4D *)0x0;
  paVar8->mColors[1] = (aiColor4D *)0x0;
  paVar8->mColors[2] = (aiColor4D *)0x0;
  paVar8->mColors[3] = (aiColor4D *)0x0;
  paVar8->mColors[4] = (aiColor4D *)0x0;
  paVar8->mColors[5] = (aiColor4D *)0x0;
  paVar8->mColors[6] = (aiColor4D *)0x0;
  paVar8->mColors[7] = (aiColor4D *)0x0;
  paVar8->mPrimitiveTypes = 4;
  __n = (this->super_ISubMesh).name._M_string_length;
  if (0xfffffffffffffc00 < __n - 0x400) {
    (paVar8->mName).length = (ai_uint32)__n;
    memcpy((paVar8->mName).data,(this->super_ISubMesh).name._M_dataplus._M_p,__n);
    (paVar8->mName).data[__n] = '\0';
  }
  uVar2 = (this->super_ISubMesh).materialIndex;
  if (uVar2 != 0xffffffff) {
    paVar8->mMaterialIndex = uVar2;
  }
  ppVVar9 = &this->vertexData;
  if ((this->super_ISubMesh).usesSharedVertexData != false) {
    ppVVar9 = &parent->sharedVertexData;
  }
  this_00 = *ppVVar9;
  pVVar3 = (this_00->vertexElements).
           super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar26 = (this_00->vertexElements).
            super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (pVVar29 = pVVar26; pVVar27 = pVVar26, pVVar29 != pVVar3; pVVar29 = pVVar29 + 1) {
    if (pVVar29->index == 0 && pVVar29->semantic == VES_POSITION) goto joined_r0x00489a67;
  }
  pVVar29 = (pointer)0x0;
joined_r0x00489a67:
  do {
    pVVar28 = pVVar26;
    if (pVVar27 == pVVar3) break;
    if (pVVar27->index == 0 && pVVar27->semantic == VES_NORMAL) goto joined_r0x00489a94;
    pVVar27 = pVVar27 + 1;
  } while( true );
  pVVar27 = (pointer)0x0;
joined_r0x00489a94:
  do {
    if (pVVar28 == pVVar3) break;
    if (pVVar28->index == 0 && pVVar28->semantic == VES_TEXTURE_COORDINATES)
    goto joined_r0x00489ac1;
    pVVar28 = pVVar28 + 1;
  } while( true );
  pVVar28 = (pointer)0x0;
joined_r0x00489ac1:
  do {
    if (pVVar26 == pVVar3) {
      pVVar26 = (pointer)0x0;
LAB_00489ae6:
      if (pVVar29 == (pointer)0x0) {
        prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!"
                   ,"");
        std::runtime_error::runtime_error(prVar21,(string *)local_1a8);
        *(undefined ***)prVar21 = &PTR__runtime_error_007fa260;
        __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (pVVar29->type != VET_FLOAT3) {
        prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported."
                   ,"");
        std::runtime_error::runtime_error(prVar21,(string *)local_1a8);
        *(undefined ***)prVar21 = &PTR__runtime_error_007fa260;
        __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((pVVar27 != (pointer)0x0) && (pVVar27->type != VET_FLOAT3)) {
        prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported."
                   ,"");
        std::runtime_error::runtime_error(prVar21,(string *)local_1a8);
        *(undefined ***)prVar21 = &PTR__runtime_error_007fa260;
        __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar2 = this->indexData->faceCount;
      paVar8->mNumFaces = uVar2;
      uVar24 = (ulong)uVar2;
      puVar10 = (ulong *)operator_new__(uVar24 * 0x10 + 8);
      *puVar10 = uVar24;
      paVar11 = (aiFace *)(puVar10 + 1);
      if (uVar2 != 0) {
        paVar22 = paVar11;
        do {
          paVar22->mNumIndices = 0;
          paVar22->mIndices = (uint *)0x0;
          paVar22 = paVar22 + 1;
        } while (paVar22 != paVar11 + uVar24);
      }
      paVar8->mFaces = paVar11;
      uVar2 = uVar2 * 3;
      paVar8->mNumVertices = uVar2;
      paVar12 = (aiVector3D *)operator_new__((ulong)uVar2 * 0xc);
      if (uVar24 != 0) {
        memset(paVar12,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *local_1f8 = paVar12;
      local_1e8 = VertexData::VertexBuffer(this_00,pVVar29->source);
      if (pVVar27 == (pointer)0x0) {
        local_2a0 = (MemoryStream *)0x0;
      }
      else {
        local_2a0 = VertexData::VertexBuffer(this_00,pVVar27->source);
      }
      if (pVVar28 == (pointer)0x0) {
        local_2c8 = (MemoryStream *)0x0;
      }
      else {
        local_2c8 = VertexData::VertexBuffer(this_00,pVVar28->source);
      }
      if (pVVar26 == (pointer)0x0) {
        local_2d0 = (MemoryStream *)0x0;
      }
      else {
        local_2d0 = VertexData::VertexBuffer(this_00,pVVar26->source);
      }
      local_1b8 = VertexElement::TypeSize(pVVar29->type);
      if (pVVar27 == (pointer)0x0) {
        local_208 = 0;
      }
      else {
        local_208 = VertexElement::TypeSize(pVVar27->type);
      }
      if (pVVar28 == (pointer)0x0) {
        local_220 = 0;
      }
      else {
        local_220 = VertexElement::TypeSize(pVVar28->type);
      }
      if (pVVar26 == (pointer)0x0) {
        local_230 = 0;
      }
      else {
        local_230 = VertexElement::TypeSize(pVVar26->type);
      }
      uVar6 = VertexData::VertexSize(this_00,pVVar29->source);
      if (pVVar27 == (pointer)0x0) {
        local_200 = 0;
      }
      else {
        uVar7 = VertexData::VertexSize(this_00,pVVar27->source);
        local_200 = (ulong)uVar7;
      }
      if (pVVar28 == (pointer)0x0) {
        local_218 = 0;
      }
      else {
        uVar7 = VertexData::VertexSize(this_00,pVVar28->source);
        local_218 = (ulong)uVar7;
      }
      if (pVVar26 == (pointer)0x0) {
        local_228 = 0;
      }
      else {
        uVar7 = VertexData::VertexSize(this_00,pVVar26->source);
        local_228 = (ulong)uVar7;
      }
      local_1d8 = (this_00->super_IVertexData).boneAssignments.
                  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_1e0 = (this_00->super_IVertexData).boneAssignments.
                  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_2a0 != (MemoryStream *)0x0) {
        uVar2 = paVar8->mNumVertices;
        paVar12 = (aiVector3D *)operator_new__((ulong)uVar2 * 0xc);
        if (uVar2 != 0) {
          memset(paVar12,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar8->mNormals = paVar12;
      }
      local_1b0 = pVVar29;
      if (local_2c8 == (MemoryStream *)0x0) {
        local_2c8 = (MemoryStream *)0x0;
      }
      else if (pVVar28->type - VET_FLOAT2 < 2) {
        sVar13 = VertexElement::ComponentCount(pVVar28->type);
        paVar8->mNumUVComponents[0] = (uint)sVar13;
        uVar2 = paVar8->mNumVertices;
        paVar12 = (aiVector3D *)operator_new__((ulong)uVar2 * 0xc);
        if (uVar2 != 0) {
          memset(paVar12,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar8->mTextureCoords[0] = paVar12;
      }
      else {
        pLVar14 = DefaultLogger::get();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Ogre imported UV0 type ",0x17);
        VertexElement::TypeToString_abi_cxx11_
                  (&local_250,(VertexElement *)(ulong)pVVar28->type,type);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," is not compatible with Assimp. Ignoring UV.",0x2c);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar14,(char *)local_280._M_impl._0_8_);
        if ((_Base_ptr *)local_280._M_impl._0_8_ !=
            &local_280._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_280._M_impl._0_8_,
                          (ulong)((long)&(local_280._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_2c8 = (MemoryStream *)0x0;
      }
      if (local_2d0 == (MemoryStream *)0x0) {
        local_2d0 = (MemoryStream *)0x0;
      }
      else if (pVVar26->type - VET_FLOAT2 < 2) {
        sVar13 = VertexElement::ComponentCount(pVVar26->type);
        paVar8->mNumUVComponents[1] = (uint)sVar13;
        uVar2 = paVar8->mNumVertices;
        paVar12 = (aiVector3D *)operator_new__((ulong)uVar2 * 0xc);
        if (uVar2 != 0) {
          memset(paVar12,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar8->mTextureCoords[1] = paVar12;
      }
      else {
        pLVar14 = DefaultLogger::get();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Ogre imported UV0 type ",0x17);
        VertexElement::TypeToString_abi_cxx11_
                  (&local_250,(VertexElement *)(ulong)pVVar26->type,type_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," is not compatible with Assimp. Ignoring UV.",0x2c);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar14,(char *)local_280._M_impl._0_8_);
        if ((_Base_ptr *)local_280._M_impl._0_8_ !=
            &local_280._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_280._M_impl._0_8_,
                          (ulong)((long)&(local_280._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_2d0 = (MemoryStream *)0x0;
      }
      if (local_2c8 == (MemoryStream *)0x0) {
        local_2a8 = (aiVector3D *)0x0;
      }
      else {
        local_2a8 = paVar8->mTextureCoords[0];
      }
      if (local_2d0 == (MemoryStream *)0x0) {
        local_2b0 = (aiVector3D *)0x0;
      }
      else {
        local_2b0 = paVar8->mTextureCoords[1];
      }
      bVar33 = this->indexData->is32bit;
      local_1d0 = 6;
      if (bVar33 != false) {
        local_1d0 = 0xc;
      }
      if (paVar8->mNumFaces != 0) {
        local_1c0 = (ulong)uVar6;
        peVar4 = (this->indexData->buffer).
                 super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_210 = (ulong)bVar33 * 2 + 2;
        bVar33 = local_2a8 != (aiVector3D *)0x0;
        bVar34 = local_2b0 != (aiVector3D *)0x0;
        lVar32 = 0;
        local_1f0 = 0;
        uVar24 = 0;
        do {
          pvVar15 = operator_new__(0xc);
          (*(peVar4->super_IOStream)._vptr_IOStream[4])(peVar4,uVar24 * local_1d0,0);
          if (this->indexData->is32bit == true) {
            (*(peVar4->super_IOStream)._vptr_IOStream[2])(peVar4,pvVar15,local_210,3);
          }
          else {
            local_1a8[0]._M_impl._0_8_ = local_1a8[0]._M_impl._0_8_ & 0xffffffffffff0000;
            lVar30 = 0;
            do {
              (*(peVar4->super_IOStream)._vptr_IOStream[2])(peVar4,local_1a8,local_210,1);
              *(uint *)((long)pvVar15 + lVar30 * 4) = (uint)(ushort)local_1a8[0]._M_impl._0_2_;
              lVar30 = lVar30 + 1;
            } while (lVar30 != 3);
          }
          paVar11 = paVar8->mFaces;
          paVar11[uVar24].mNumIndices = 3;
          local_1c8 = uVar24;
          puVar16 = (uint *)operator_new__(0xc);
          paVar11[uVar24].mIndices = puVar16;
          lVar30 = 0;
          lVar31 = 0;
          do {
            uVar6 = (int)local_1f0 + (int)lVar31;
            paVar11[uVar24].mIndices[lVar31] = uVar6;
            uVar2 = *(uint *)((long)pvVar15 + lVar31 * 4);
            uVar23 = (ulong)uVar2;
            IVertexData::AddVertexMapping(&this_00->super_IVertexData,uVar2,uVar6);
            (*(local_1e8->super_IOStream)._vptr_IOStream[4])
                      (local_1e8,(ulong)local_1b0->offset + uVar23 * local_1c0,0);
            (*(local_1e8->super_IOStream)._vptr_IOStream[2])
                      (local_1e8,(long)&(*local_1f8)->x + lVar30 + lVar32,local_1b8,1);
            if (local_2a0 != (MemoryStream *)0x0) {
              (*(local_2a0->super_IOStream)._vptr_IOStream[4])
                        (local_2a0,(ulong)pVVar27->offset + local_200 * uVar23,0);
              (*(local_2a0->super_IOStream)._vptr_IOStream[2])
                        (local_2a0,(long)&paVar8->mNormals->x + lVar30 + lVar32,local_208,1);
            }
            if (bVar33 && local_2c8 != (MemoryStream *)0x0) {
              (*(local_2c8->super_IOStream)._vptr_IOStream[4])
                        (local_2c8,(ulong)pVVar28->offset + local_218 * uVar23,0);
              (*(local_2c8->super_IOStream)._vptr_IOStream[2])
                        (local_2c8,(long)&local_2a8->x + lVar30,local_220,1);
              *(float *)((long)&local_2a8->y + lVar30) =
                   1.0 - *(float *)((long)&local_2a8->y + lVar30);
            }
            if (bVar34 && local_2d0 != (MemoryStream *)0x0) {
              (*(local_2d0->super_IOStream)._vptr_IOStream[4])
                        (local_2d0,(ulong)pVVar26->offset + uVar23 * local_228,0);
              (*(local_2d0->super_IOStream)._vptr_IOStream[2])
                        (local_2d0,(long)&local_2b0->x + lVar30,local_230,1);
              *(float *)((long)&local_2b0->y + lVar30) =
                   1.0 - *(float *)((long)&local_2b0->y + lVar30);
            }
            lVar31 = lVar31 + 1;
            lVar30 = lVar30 + 0xc;
          } while (lVar30 != 0x24);
          operator_delete__(pvVar15);
          uVar24 = local_1c8 + 1;
          local_1f0 = local_1f0 + 3;
          lVar32 = lVar32 + 0x24;
          local_2a8 = local_2a8 + 3;
          local_2b0 = local_2b0 + 3;
        } while (uVar24 < paVar8->mNumFaces);
      }
      if ((local_1d8 != local_1e0) && (parent->skeleton != (Skeleton *)0x0)) {
        IVertexData::AssimpBoneWeights
                  ((AssimpVertexBoneWeightList *)local_1a8,&this_00->super_IVertexData,
                   (ulong)paVar8->mNumVertices);
        IVertexData::ReferencedBonesByWeights
                  ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                    *)&local_280,&this_00->super_IVertexData);
        paVar8->mNumBones = (uint)local_280._M_impl.super__Rb_tree_header._M_node_count;
        ppaVar17 = (aiBone **)
                   operator_new__((local_280._M_impl.super__Rb_tree_header._M_node_count &
                                  0xffffffff) << 3);
        paVar8->mBones = ppaVar17;
        p_Var1 = &local_280._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)local_280._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
        {
          lVar32 = 0;
          p_Var20 = local_280._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            ppBVar18 = (parent->skeleton->bones).
                       super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppBVar5 = (parent->skeleton->bones).
                      super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppBVar18 != ppBVar5) {
              do {
                this_01 = *ppBVar18;
                if (this_01->id == (short)p_Var20[1]._M_color) goto LAB_0048a598;
                ppBVar18 = ppBVar18 + 1;
              } while (ppBVar18 != ppBVar5);
            }
            this_01 = (Bone *)0x0;
LAB_0048a598:
            pBVar25 = this_01;
            boneWeights = std::
                          map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                          ::operator[]((map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                        *)local_1a8,&this_01->id);
            paVar19 = Bone::ConvertToAssimpBone(this_01,(Skeleton *)pBVar25,boneWeights);
            ppaVar17[lVar32] = paVar19;
            p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
            lVar32 = lVar32 + 1;
          } while ((_Rb_tree_header *)p_Var20 != p_Var1);
        }
        std::
        _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
        ::~_Rb_tree(&local_280);
        std::
        _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
        ::~_Rb_tree(local_1a8);
      }
      return paVar8;
    }
    if (pVVar26->index == 1 && pVVar26->semantic == VES_TEXTURE_COORDINATES) goto LAB_00489ae6;
    pVVar26 = pVVar26 + 1;
  } while( true );
}

Assistant:

aiMesh *SubMesh::ConvertToAssimpMesh(Mesh *parent)
{
    if (operationType != OT_TRIANGLE_LIST) {
        throw DeadlyImportError(Formatter::format() << "Only mesh operation type OT_TRIANGLE_LIST is supported. Found " << operationType);
    }

    aiMesh *dest = new aiMesh();
    dest->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    if (!name.empty())
        dest->mName = name;

    // Material index
    if (materialIndex != -1)
        dest->mMaterialIndex = materialIndex;

    // Pick source vertex data from shader geometry or from internal geometry.
    VertexData *src = (!usesSharedVertexData ? vertexData : parent->sharedVertexData);

    VertexElement *positionsElement = src->GetVertexElement(VertexElement::VES_POSITION);
    VertexElement *normalsElement   = src->GetVertexElement(VertexElement::VES_NORMAL);
    VertexElement *uv1Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 0);
    VertexElement *uv2Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 1);

    // Sanity checks
    if (!positionsElement) {
        throw DeadlyImportError("Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!");
    } else if (positionsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    } else if (normalsElement && normalsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    }

    // Faces
    dest->mNumFaces = indexData->faceCount;
    dest->mFaces = new aiFace[dest->mNumFaces];

    // Assimp required unique vertices, we need to convert from Ogres shared indexing.
    size_t uniqueVertexCount = dest->mNumFaces * 3;
    dest->mNumVertices = static_cast<unsigned int>(uniqueVertexCount);
    dest->mVertices = new aiVector3D[dest->mNumVertices];

    // Source streams
    MemoryStream *positions      = src->VertexBuffer(positionsElement->source);
    MemoryStream *normals        = (normalsElement ? src->VertexBuffer(normalsElement->source) : 0);
    MemoryStream *uv1            = (uv1Element ? src->VertexBuffer(uv1Element->source) : 0);
    MemoryStream *uv2            = (uv2Element ? src->VertexBuffer(uv2Element->source) : 0);

    // Element size
    const size_t sizePosition    = positionsElement->Size();
    const size_t sizeNormal      = (normalsElement ? normalsElement->Size() : 0);
    const size_t sizeUv1         = (uv1Element ? uv1Element->Size() : 0);
    const size_t sizeUv2         = (uv2Element ? uv2Element->Size() : 0);

    // Vertex width
    const size_t vWidthPosition  = src->VertexSize(positionsElement->source);
    const size_t vWidthNormal    = (normalsElement ? src->VertexSize(normalsElement->source) : 0);
    const size_t vWidthUv1       = (uv1Element ? src->VertexSize(uv1Element->source) : 0);
    const size_t vWidthUv2       = (uv2Element ? src->VertexSize(uv2Element->source) : 0);

    bool boneAssignments = src->HasBoneAssignments();

    // Prepare normals
    if (normals)
        dest->mNormals = new aiVector3D[dest->mNumVertices];

    // Prepare UVs, ignoring incompatible UVs.
    if (uv1)
    {
        if (uv1Element->type == VertexElement::VET_FLOAT2 || uv1Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[0] = static_cast<unsigned int>(uv1Element->ComponentCount());
            dest->mTextureCoords[0] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv1Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv1 = 0;
        }
    }
    if (uv2)
    {
        if (uv2Element->type == VertexElement::VET_FLOAT2 || uv2Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[1] = static_cast<unsigned int>(uv2Element->ComponentCount());
            dest->mTextureCoords[1] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv2Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv2 = 0;
        }
    }

    aiVector3D *uv1Dest = (uv1 ? dest->mTextureCoords[0] : 0);
    aiVector3D *uv2Dest = (uv2 ? dest->mTextureCoords[1] : 0);

    MemoryStream *faces = indexData->buffer.get();
    for (size_t fi=0, isize=indexData->IndexSize(), fsize=indexData->FaceSize();
         fi<dest->mNumFaces; ++fi)
    {
        // Source Ogre face
        aiFace ogreFace;
        ogreFace.mNumIndices = 3;
        ogreFace.mIndices = new unsigned int[3];

        faces->Seek(fi * fsize, aiOrigin_SET);
        if (indexData->is32bit)
        {
            faces->Read(&ogreFace.mIndices[0], isize, 3);
        }
        else
        {
            uint16_t iout = 0;
            for (size_t ii=0; ii<3; ++ii)
            {
                faces->Read(&iout, isize, 1);
                ogreFace.mIndices[ii] = static_cast<unsigned int>(iout);
            }
        }

        // Destination Assimp face
        aiFace &face = dest->mFaces[fi];
        face.mNumIndices = 3;
        face.mIndices = new unsigned int[3];

        const size_t pos = fi * 3;
        for (size_t v=0; v<3; ++v)
        {
            const size_t newIndex = pos + v;

            // Write face index
            face.mIndices[v] = static_cast<unsigned int>(newIndex);

            // Ogres vertex index to ref into the source buffers.
            const size_t ogreVertexIndex = ogreFace.mIndices[v];
            src->AddVertexMapping(static_cast<uint32_t>(ogreVertexIndex), static_cast<uint32_t>(newIndex));

            // Position
            positions->Seek((vWidthPosition * ogreVertexIndex) + positionsElement->offset, aiOrigin_SET);
            positions->Read(&dest->mVertices[newIndex], sizePosition, 1);

            // Normal
            if (normals)
            {
                normals->Seek((vWidthNormal * ogreVertexIndex) + normalsElement->offset, aiOrigin_SET);
                normals->Read(&dest->mNormals[newIndex], sizeNormal, 1);
            }
            // UV0
            if (uv1 && uv1Dest)
            {
                uv1->Seek((vWidthUv1 * ogreVertexIndex) + uv1Element->offset, aiOrigin_SET);
                uv1->Read(&uv1Dest[newIndex], sizeUv1, 1);
                uv1Dest[newIndex].y = (uv1Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
            // UV1
            if (uv2 && uv2Dest)
            {
                uv2->Seek((vWidthUv2 * ogreVertexIndex) + uv2Element->offset, aiOrigin_SET);
                uv2->Read(&uv2Dest[newIndex], sizeUv2, 1);
                uv2Dest[newIndex].y = (uv2Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
        }
    }

    // Bones and bone weights
    if (parent->skeleton && boneAssignments)
    {
        AssimpVertexBoneWeightList weights = src->AssimpBoneWeights(dest->mNumVertices);
        std::set<uint16_t> referencedBones = src->ReferencedBonesByWeights();

        dest->mNumBones = static_cast<unsigned int>(referencedBones.size());
        dest->mBones = new aiBone*[dest->mNumBones];

        size_t assimpBoneIndex = 0;
        for(std::set<uint16_t>::const_iterator rbIter=referencedBones.begin(), rbEnd=referencedBones.end(); rbIter != rbEnd; ++rbIter, ++assimpBoneIndex)
        {
            Bone *bone = parent->skeleton->BoneById((*rbIter));
            dest->mBones[assimpBoneIndex] = bone->ConvertToAssimpBone(parent->skeleton, weights[bone->id]);
        }
    }

    return dest;
}